

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_uint64(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint64_t val,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  pointer psVar2;
  uint uVar3;
  long lVar4;
  uint8_t buf_2 [2];
  uint8_t buf_1 [4];
  uint8_t buf [8];
  ushort local_26;
  uint local_24;
  ulong local_20;
  
  if (val < 0x100) {
    binary_stream_sink::push_back(&this->sink_,'U');
    binary_stream_sink::push_back(&this->sink_,(uint8_t)val);
  }
  else if (val < 0x8000) {
    binary_stream_sink::push_back(&this->sink_,'I');
    local_26 = (ushort)val << 8 | (ushort)val >> 8;
    lVar4 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_26 + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  else if (val < 0x80000000) {
    binary_stream_sink::push_back(&this->sink_,'l');
    uVar3 = (uint)val;
    local_24 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    lVar4 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_24 + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else if (-1 < (long)val) {
    binary_stream_sink::push_back(&this->sink_,'L');
    local_20 = val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
               (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
               (val & 0xff00) << 0x28 | val << 0x38;
    lVar4 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_20 + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
                      semantic_tag, 
                      const ser_context&,
                      std::error_code&) override
    {
        if (val <= (std::numeric_limits<uint8_t>::max)())
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::uint8_type);
            binary::native_to_big(static_cast<uint8_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int16_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int16_type);
            binary::native_to_big(static_cast<int16_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int32_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int32_type);
            binary::native_to_big(static_cast<int32_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int64_type);
            binary::native_to_big(static_cast<int64_t>(val),std::back_inserter(sink_));
        }
        end_value();
        JSONCONS_VISITOR_RETURN;
    }